

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interfaces.cpp
# Opt level: O3

int __thiscall node::anon_unknown_2::NodeImpl::getNumBlocks(NodeImpl *this)

{
  pointer ppCVar1;
  pointer ppCVar2;
  unique_ptr<ChainstateManager,_std::default_delete<ChainstateManager>_> *puVar3;
  Chainstate *pCVar4;
  long in_FS_OFFSET;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock21;
  unique_lock<std::recursive_mutex> local_20;
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  local_20._M_device = &cs_main.super_recursive_mutex;
  local_20._M_owns = false;
  std::unique_lock<std::recursive_mutex>::lock(&local_20);
  puVar3 = inline_assertion_check<true,std::unique_ptr<ChainstateManager,std::default_delete<ChainstateManager>>&>
                     (&this->m_context->chainman,
                      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/node/interfaces.cpp"
                      ,0x1a6,"chainman","m_context->chainman");
  pCVar4 = ChainstateManager::ActiveChainstate
                     ((puVar3->_M_t).
                      super___uniq_ptr_impl<ChainstateManager,_std::default_delete<ChainstateManager>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_ChainstateManager_*,_std::default_delete<ChainstateManager>_>
                      .super__Head_base<0UL,_ChainstateManager_*,_false>._M_head_impl);
  ppCVar1 = (pCVar4->m_chain).vChain.
            super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  ppCVar2 = (pCVar4->m_chain).vChain.
            super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  std::unique_lock<std::recursive_mutex>::~unique_lock(&local_20);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
    return (int)((ulong)((long)ppCVar1 - (long)ppCVar2) >> 3) + -1;
  }
  __stack_chk_fail();
}

Assistant:

int getNumBlocks() override
    {
        LOCK(::cs_main);
        return chainman().ActiveChain().Height();
    }